

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

void __thiscall SQArray::Mark(SQArray *this,SQCollectable **chain)

{
  ulong uVar1;
  long lVar2;
  SQUnsignedInteger SVar3;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    SVar3 = (this->_values)._size;
    if (0 < (long)SVar3) {
      lVar2 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&(((this->_values)._vals)->super_SQObject)._type + lVar2),
                   (SQCollectable_conflict **)chain);
        lVar2 = lVar2 + 0x10;
        SVar3 = SVar3 - 1;
      } while (SVar3 != 0);
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQArray::Mark(SQCollectable **chain)
{
    START_MARK()
        SQInteger len = _values.size();
        for(SQInteger i = 0;i < len; i++) SQSharedState::MarkObject(_values[i], chain);
    END_MARK()
}